

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

aom_codec_err_t av1_firstpass_info_push(FIRSTPASS_INFO *firstpass_info,FIRSTPASS_STATS *input_stats)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  long in_RDI;
  int next_index;
  FIRSTPASS_STATS *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  aom_codec_err_t local_4;
  
  bVar1 = *(int *)(in_RDI + 0x2c70) <= *(int *)(in_RDI + 0x2c78);
  if (!bVar1) {
    iVar2 = (*(int *)(in_RDI + 0x2c74) + *(int *)(in_RDI + 0x2c78)) % *(int *)(in_RDI + 0x2c70);
    memcpy((void *)(*(long *)(in_RDI + 0x2c68) + (long)iVar2 * 0xe8),in_RSI,0xe8);
    *(int *)(in_RDI + 0x2c78) = *(int *)(in_RDI + 0x2c78) + 1;
    *(int *)(in_RDI + 0x2c80) = *(int *)(in_RDI + 0x2c80) + 1;
    av1_accumulate_stats
              ((FIRSTPASS_STATS *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  local_4 = (aom_codec_err_t)bVar1;
  return local_4;
}

Assistant:

aom_codec_err_t av1_firstpass_info_push(FIRSTPASS_INFO *firstpass_info,
                                        const FIRSTPASS_STATS *input_stats) {
  if (firstpass_info->stats_count < firstpass_info->stats_buf_size) {
    const int next_index =
        (firstpass_info->start_index + firstpass_info->stats_count) %
        firstpass_info->stats_buf_size;
    firstpass_info->stats_buf[next_index] = *input_stats;
    ++firstpass_info->stats_count;
    ++firstpass_info->future_stats_count;
    av1_accumulate_stats(&firstpass_info->total_stats, input_stats);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_ERROR;
  }
}